

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobjectdefs.h
# Opt level: O2

void QMetaObject::activate<void,QListWidgetItem*,QListWidgetItem*>
               (QObject *sender,QMetaObject *mo,int param_3,void *ret,QListWidgetItem **args,
               QListWidgetItem **args_1)

{
  long in_FS_OFFSET;
  void *local_28;
  QListWidgetItem **local_20;
  QListWidgetItem **local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = ret;
  local_20 = args;
  local_18 = args_1;
  QMetaObject::activate(sender,mo,param_3,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void
    activate(QObject *sender, const QMetaObject *mo, int local_signal_index, Ret *ret, const Args &... args)
    {
        void *_a[] = {
            const_cast<void *>(reinterpret_cast<const volatile void *>(ret)),
            const_cast<void *>(reinterpret_cast<const volatile void *>(std::addressof(args)))...
        };
        activate(sender, mo, local_signal_index, _a);
    }